

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O0

int32_t uenum_count_63(UEnumeration *en,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *status_local;
  UEnumeration *en_local;
  
  if ((en != (UEnumeration *)0x0) && (UVar1 = U_FAILURE(*status), UVar1 == '\0')) {
    if (en->count != (UEnumCount *)0x0) {
      iVar2 = (*en->count)(en,status);
      return iVar2;
    }
    *status = U_UNSUPPORTED_ERROR;
    return -1;
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uenum_count(UEnumeration* en, UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return -1;
    }
    if (en->count != NULL) {
        return en->count(en, status);
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return -1;
    }
}